

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1.cpp
# Opt level: O1

int main(void)

{
  undefined8 *****pppppuVar1;
  undefined8 *****pppppuVar2;
  bool bVar3;
  in_addr_t iVar4;
  int iVar5;
  ostream *poVar6;
  RTPPacket *p;
  int *piVar7;
  uint uVar8;
  ulong uVar9;
  timespec req;
  string ipstr;
  timespec rem;
  RTPSessionParams sessparams;
  RTPUDPv4TransmissionParams transparams;
  RTPIPv4Address addr;
  RTPSession sess;
  timespec tStack_10948;
  long *aplStack_10938 [2];
  long alStack_10928 [2];
  timespec tStack_10918;
  undefined1 auStack_10908 [128];
  _Alloc_hider _Stack_10888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_10878;
  RTPLibraryVersion RStack_10860;
  undefined2 uStack_10854;
  undefined8 uStack_10850;
  undefined8 ****ppppuStack_10848;
  undefined8 ****ppppuStack_10840;
  undefined8 uStack_10838;
  undefined1 uStack_10830;
  undefined8 uStack_1082c;
  undefined8 uStack_10824;
  undefined5 uStack_1081c;
  undefined3 uStack_10817;
  undefined5 uStack_10814;
  undefined8 uStack_10808;
  RTPAddress RStack_10800;
  undefined4 uStack_107f0;
  RTPSession RStack_107e8;
  
  jrtplib::RTPSession::RTPSession(&RStack_107e8,(RTPRandom *)0x0,(RTPMemoryManager *)0x0);
  aplStack_10938[0] = alStack_10928;
  std::__cxx11::string::_M_construct<char_const*>((string *)aplStack_10938,"0.0.0.0","");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Using version ",0xe);
  RStack_10860 = jrtplib::RTPLibraryVersion::GetVersion();
  jrtplib::RTPLibraryVersion::GetVersionString_abi_cxx11_((string *)auStack_10908,&RStack_10860);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)CONCAT71(auStack_10908._1_7_,auStack_10908[0]),
                      auStack_10908._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if ((undefined1 *)CONCAT71(auStack_10908._1_7_,auStack_10908[0]) != auStack_10908 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(auStack_10908._1_7_,auStack_10908[0]),
                    auStack_10908._16_8_ + 1);
  }
  iVar4 = inet_addr((char *)aplStack_10938[0]);
  RStack_10860 = (RTPLibraryVersion)ZEXT812(0x13aea0);
  uStack_10838 = 0;
  uStack_10854 = 5000;
  uStack_10850 = 0;
  uStack_10830 = 1;
  uStack_1082c = 0x800000008000;
  uStack_10824 = 0x800000008000;
  uStack_10808 = 0;
  uStack_1081c = 0;
  uStack_10817 = 0;
  uStack_10814 = 0;
  ppppuStack_10848 = &ppppuStack_10848;
  ppppuStack_10840 = &ppppuStack_10848;
  jrtplib::RTPSessionParams::RTPSessionParams((RTPSessionParams *)auStack_10908);
  auStack_10908._16_8_ = 0x3fb999999999999a;
  auStack_10908[0] = true;
  uStack_10854 = 8000;
  iVar5 = jrtplib::RTPSession::Create
                    (&RStack_107e8,(RTPSessionParams *)auStack_10908,
                     (RTPTransmissionParams *)&RStack_10860,IPv4UDPProto);
  checkerror(iVar5);
  RStack_10800._12_4_ =
       iVar4 >> 0x18 | (iVar4 & 0xff0000) >> 8 | (iVar4 & 0xff00) << 8 | iVar4 << 0x18;
  RStack_10800.addresstype = IPv4Address;
  RStack_10800._vptr_RTPAddress = (_func_int **)&PTR_CreateCopy_0013bbb0;
  uStack_107f0 = 0x27112710;
  iVar5 = jrtplib::RTPSession::AddDestination(&RStack_107e8,&RStack_10800);
  checkerror(iVar5);
  uVar9 = 1;
  do {
    printf("\nSending packet %d/%d\n",uVar9,100);
    iVar5 = jrtplib::RTPSession::SendPacket(&RStack_107e8,"1234567890",10,'\0',false,10);
    checkerror(iVar5);
    jrtplib::RTPSession::BeginDataAccess(&RStack_107e8);
    bVar3 = jrtplib::RTPSession::GotoFirstSourceWithData(&RStack_107e8);
    while (bVar3 != false) {
      while (p = jrtplib::RTPSession::GetNextPacket(&RStack_107e8), p != (RTPPacket *)0x0) {
        puts("Got packet !");
        jrtplib::RTPSession::DeletePacket(&RStack_107e8,p);
      }
      bVar3 = jrtplib::RTPSession::GotoNextSourceWithData(&RStack_107e8);
    }
    jrtplib::RTPSession::EndDataAccess(&RStack_107e8);
    iVar5 = jrtplib::RTPSession::Poll(&RStack_107e8);
    checkerror(iVar5);
    tStack_10948.tv_sec = 1;
    tStack_10948.tv_nsec = 0;
    do {
      iVar5 = nanosleep(&tStack_10948,&tStack_10918);
      tStack_10948.tv_sec = tStack_10918.tv_sec;
      tStack_10948.tv_nsec = tStack_10918.tv_nsec;
      if (iVar5 != -1) break;
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
    uVar8 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar8;
    if (uVar8 == 0x65) {
      tStack_10948.tv_sec = 0x4024000000000000;
      jrtplib::RTPSession::BYEDestroy(&RStack_107e8,(RTPTime *)&tStack_10948,(void *)0x0,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_10888._M_p != &aStack_10878) {
        operator_delete(_Stack_10888._M_p,aStack_10878._M_allocated_capacity + 1);
      }
      RStack_10860._0_8_ = &PTR__RTPUDPv4TransmissionParams_0013aea0;
      pppppuVar2 = (undefined8 *****)ppppuStack_10848;
      while (pppppuVar2 != &ppppuStack_10848) {
        pppppuVar1 = (undefined8 *****)*pppppuVar2;
        operator_delete(pppppuVar2,0x18);
        pppppuVar2 = pppppuVar1;
      }
      if (aplStack_10938[0] != alStack_10928) {
        operator_delete(aplStack_10938[0],alStack_10928[0] + 1);
      }
      jrtplib::RTPSession::~RTPSession(&RStack_107e8);
      return 0;
    }
  } while( true );
}

Assistant:

int main(void)
{
#ifdef RTP_SOCKETTYPE_WINSOCK
	WSADATA dat;
	WSAStartup(MAKEWORD(2,2),&dat);
#endif // RTP_SOCKETTYPE_WINSOCK
	
	RTPSession sess;
	uint16_t portbase = 8000;
	std::string ipstr = "0.0.0.0";
	uint16_t destport = 10000;
	uint32_t destip;
	int status,i;
	int num = 100;

	std::cout << "Using version " << RTPLibraryVersion::GetVersion().GetVersionString() << std::endl;

	// First, we'll ask for the necessary information
		
	destip = inet_addr(ipstr.c_str());
	
	// The inet_addr function returns a value in network byte order, but
	// we need the IP address in host byte order, so we use a call to
	// ntohl
	destip = ntohl(destip);
	
	// Now, we'll create a RTP session, set the destination, send some
	// packets and poll for incoming data.
	
	RTPUDPv4TransmissionParams transparams;
	RTPSessionParams sessparams;
	
	// IMPORTANT: The local timestamp unit MUST be set, otherwise
	//            RTCP Sender Report info will be calculated wrong
	// In this case, we'll be sending 10 samples each second, so we'll
	// put the timestamp unit to (1.0/10.0)
	sessparams.SetOwnTimestampUnit(1.0/10.0);		
	
	sessparams.SetAcceptOwnPackets(true);
	transparams.SetPortbase(portbase);
	status = sess.Create(sessparams,&transparams);	
	checkerror(status);
	
	RTPIPv4Address addr(destip,destport);
	
	status = sess.AddDestination(addr);
	checkerror(status);
	
	for (i = 1 ; i <= num ; i++)
	{
		printf("\nSending packet %d/%d\n",i,num);
		
		// send the packet
		status = sess.SendPacket((void *)"1234567890",10,0,false,10);
		checkerror(status);
		
		sess.BeginDataAccess();
		
		// check incoming packets
		if (sess.GotoFirstSourceWithData())
		{
			do
			{
				RTPPacket *pack;
				
				while ((pack = sess.GetNextPacket()) != NULL)
				{
					// You can examine the data here
					printf("Got packet !\n");
					
					// we don't longer need the packet, so
					// we'll delete it
					sess.DeletePacket(pack);
				}
			} while (sess.GotoNextSourceWithData());
		}
		
		sess.EndDataAccess();

#ifndef RTP_SUPPORT_THREAD
		status = sess.Poll();
		checkerror(status);
#endif // RTP_SUPPORT_THREAD
		
		RTPTime::Wait(RTPTime(1,0));
	}
	
	sess.BYEDestroy(RTPTime(10,0),0,0);

#ifdef RTP_SOCKETTYPE_WINSOCK
	WSACleanup();
#endif // RTP_SOCKETTYPE_WINSOCK
	return 0;
}